

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O2

bool __thiscall spirv_cross::CompilerMSL::is_patch_block(CompilerMSL *this,SPIRType *type)

{
  ulong uVar1;
  bool bVar2;
  uint32_t i;
  ulong uVar3;
  bool bVar4;
  
  bVar2 = Compiler::has_decoration
                    ((Compiler *)this,(ID)(type->super_IVariant).self.id,DecorationBlock);
  uVar3 = 0;
  bVar4 = false;
  if (bVar2) {
    do {
      uVar1 = (type->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
              buffer_size;
      bVar4 = uVar1 <= uVar3;
      if (uVar1 <= uVar3) {
        return bVar4;
      }
      bVar2 = Compiler::has_member_decoration
                        ((Compiler *)this,(TypeID)(type->super_IVariant).self.id,(uint32_t)uVar3,
                         DecorationPatch);
      uVar3 = (ulong)((uint32_t)uVar3 + 1);
    } while (bVar2);
  }
  return bVar4;
}

Assistant:

bool CompilerMSL::is_patch_block(const SPIRType &type)
{
	if (!has_decoration(type.self, DecorationBlock))
		return false;

	for (uint32_t i = 0; i < type.member_types.size(); i++)
	{
		if (!has_member_decoration(type.self, i, DecorationPatch))
			return false;
	}

	return true;
}